

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall dtc::fdt::property::parse_string(property *this,text_input_buffer *input)

{
  bool bVar1;
  _Elt_pointer psVar2;
  _Elt_pointer psVar3;
  element_type *peVar4;
  int iVar5;
  char cVar6;
  _Elt_pointer psVar7;
  bool bVar8;
  bool bVar9;
  vector<char,_std::allocator<char>_> bytes;
  char c;
  property_value v;
  void *local_f8;
  iterator iStack_f0;
  char *local_e8;
  property *local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pointer local_50;
  pointer puStack_48;
  pointer local_40;
  value_type local_38;
  
  local_a8 = 0;
  local_a0 = 0;
  local_90._0_8_ = local_90 + 0x10;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_90,&local_a0,&local_a0);
  local_70._M_p = (pointer)&local_60;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50 = (pointer)0x0;
  puStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  local_38 = UNKNOWN;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  psVar2 = (input->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar3 = (input->input_stack).c.
           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar3 != psVar2) {
    psVar7 = psVar3;
    if (psVar3 == (input->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar7 = (input->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar4 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar5 = peVar4->cursor;
    if (((-1 < (long)iVar5) && (iVar5 < peVar4->size)) && (peVar4->buffer[iVar5] == '\"')) {
      if (psVar3 != psVar2) {
        input->cursor = input->cursor + 1;
        if (psVar3 == (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar3 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar4 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar5 = peVar4->cursor + 1;
        peVar4->cursor = iVar5;
        if (peVar4->size <= iVar5) {
          std::
          deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
          ::pop_back(&(input->input_stack).c);
        }
      }
      local_f8 = (void *)0x0;
      iStack_f0._M_current = (char *)0x0;
      local_e8 = (char *)0x0;
      bVar8 = false;
      local_d8 = this;
      do {
        psVar2 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar3 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar3 == psVar2) {
          cVar6 = '\0';
        }
        else {
          psVar7 = psVar3;
          if (psVar3 == (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar7 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar4 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar5 = peVar4->cursor;
          cVar6 = '\0';
          if ((-1 < (long)iVar5) && (iVar5 < peVar4->size)) {
            cVar6 = peVar4->buffer[iVar5];
          }
        }
        local_d0[0] = (long *)CONCAT71(local_d0[0]._1_7_,cVar6);
        if (cVar6 == '\0') {
          bVar1 = false;
        }
        else if ((cVar6 != '\"') || (bVar8)) {
          bVar8 = cVar6 == '\\';
          if (iStack_f0._M_current == local_e8) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&local_f8,iStack_f0,(char *)local_d0);
          }
          else {
            *iStack_f0._M_current = cVar6;
            iStack_f0._M_current = iStack_f0._M_current + 1;
          }
          psVar2 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar2 == (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            bVar1 = true;
          }
          else {
            input->cursor = input->cursor + 1;
            if (psVar2 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar2 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar4 = psVar2[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar5 = peVar4->cursor + 1;
            peVar4->cursor = iVar5;
            bVar9 = true;
            bVar1 = true;
LAB_00120ed9:
            if (peVar4->size <= iVar5) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&(input->input_stack).c);
              bVar1 = bVar9;
            }
          }
        }
        else {
          bVar9 = true;
          if (psVar3 != psVar2) {
            psVar7 = psVar3;
            if (psVar3 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar7 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar4 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar5 = peVar4->cursor;
            if ((-1 < (long)iVar5) && (iVar5 < peVar4->size)) {
              bVar9 = peVar4->buffer[iVar5] != '\"';
            }
          }
          bVar1 = false;
          if ((psVar3 != psVar2) && (!bVar9)) {
            input->cursor = input->cursor + 1;
            if (psVar3 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar3 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar4 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar5 = peVar4->cursor + 1;
            peVar4->cursor = iVar5;
            bVar9 = false;
            bVar1 = false;
            goto LAB_00120ed9;
          }
        }
        if (!bVar1) {
          local_d0[0] = local_c0;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((string *)local_d0,local_f8,iStack_f0._M_current);
          std::__cxx11::string::operator=((string *)&local_70,(string *)local_d0);
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
          std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
          push_back(&local_d8->values,(value_type *)local_90);
          if (local_f8 != (void *)0x0) {
            operator_delete(local_f8,(long)local_e8 - (long)local_f8);
          }
          if (local_50 != (pointer)0x0) {
            operator_delete(local_50,(long)local_40 - (long)local_50);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_p != &local_60) {
            operator_delete(local_70._M_p,
                            CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0])
                            + 1);
          }
          if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
            operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
          }
          return;
        }
      } while( true );
    }
  }
  __assert_fail("*input == \'\"\'",
                "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",0x105
                ,"void dtc::fdt::property::parse_string(text_input_buffer &)");
}

Assistant:

void
property::parse_string(text_input_buffer &input)
{
	property_value v;
	assert(*input == '"');
	++input;
	std::vector<char> bytes;
	bool isEscaped = false;
	while (char c = *input)
	{
		if (c == '"' && !isEscaped)
		{
			input.consume('"');
			break;
		}
		isEscaped = (c == '\\');
		bytes.push_back(c);
		++input;
	}
	v.string_data = string(bytes.begin(), bytes.end());
	values.push_back(v);
}